

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void el::Loggers::configureFromGlobal(char *globalConfigurationFilePath)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  ostream *poVar6;
  bool bVar7;
  Logger *logger;
  string line;
  anon_class_16_2_58e2ca49 configure;
  stringstream ss;
  ifstream gcfStream;
  undefined1 *local_418;
  string *local_410;
  undefined1 local_408 [16];
  Logger *local_3f8;
  string local_3f0;
  anon_class_16_2_58e2ca49 local_3d0;
  stringstream local_3c0 [16];
  long local_3b0;
  string local_3a8 [104];
  ios_base local_340 [264];
  long local_238 [4];
  int aiStack_218 [122];
  
  std::ifstream::ifstream(local_238,globalConfigurationFilePath,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::__cxx11::stringstream::stringstream(local_3c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_3b0,"Unable to open global configuration file [",0x2a);
    if (globalConfigurationFilePath == (char *)0x0) {
      std::ios::clear((int)(ostream *)&local_3b0 + (int)*(undefined8 *)(local_3b0 + -0x18));
    }
    else {
      sVar5 = strlen(globalConfigurationFilePath);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_3b0,globalConfigurationFilePath,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3b0,"] for parsing.",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ",0x2c);
    poVar6 = (ostream *)std::ostream::operator<<(&std::cerr,0xb7f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") [gcfStream.is_open()",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] WITH MESSAGE \"",0x10);
    std::__cxx11::stringbuf::str();
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_3f0._M_dataplus._M_p,local_3f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream(local_3c0);
    std::ios_base::~ios_base(local_340);
  }
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  local_3f0._M_string_length = 0;
  local_3f0.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_3c0);
  local_3d0.logger = &local_3f8;
  local_3f8 = (Logger *)0x0;
  lVar1 = *(long *)(local_238[0] + -0x18);
  local_3d0.ss = (stringstream *)local_3c0;
  if (*(int *)((long)aiStack_218 + lVar1) == 0) {
    do {
      cVar2 = std::ios::widen((char)&local_418 + (char)lVar1 + -0x20);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_3f0,cVar2);
      base::utils::Str::rtrim(&local_3f0);
      base::utils::Str::ltrim(&local_3f0);
      bVar3 = Configurations::Parser::isComment(&local_3f0);
      if (!bVar3) {
        Configurations::Parser::ignoreComments(&local_3f0);
        base::utils::Str::rtrim(&local_3f0);
        base::utils::Str::ltrim(&local_3f0);
        if ((string *)0x2 < local_3f0._M_string_length) {
          local_418 = local_408;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"--","");
          if (local_3f0._M_string_length < local_410) {
            bVar3 = false;
          }
          else {
            iVar4 = std::__cxx11::string::compare((ulong)&local_3f0,0,local_410);
            bVar3 = iVar4 == 0;
          }
          if (local_418 != local_408) {
            operator_delete(local_418);
          }
          if (bVar3) {
            std::__cxx11::stringbuf::str();
            bVar3 = local_410 != (string *)0x0;
            bVar7 = local_3f8 != (Logger *)0x0;
            if (local_418 != local_408) {
              operator_delete(local_418);
            }
            if (bVar3 && bVar7) {
              configureFromGlobal::anon_class_16_2_58e2ca49::operator()(&local_3d0);
            }
            local_418 = local_408;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"");
            std::__cxx11::stringbuf::str(local_3a8);
            if (local_418 != local_408) {
              operator_delete(local_418);
            }
            std::__cxx11::string::substr((ulong)&local_418,(ulong)&local_3f0);
            std::__cxx11::string::operator=((string *)&local_3f0,(string *)&local_418);
            if (local_418 != local_408) {
              operator_delete(local_418);
            }
            base::utils::Str::rtrim(&local_3f0);
            base::utils::Str::ltrim(&local_3f0);
            if ((string *)0x1 < local_3f0._M_string_length) {
              local_3f8 = base::RegisteredLoggers::get
                                    (*(RegisteredLoggers **)(base::elStorage + 0x10),&local_3f0,true
                                    );
            }
            goto LAB_00169ce3;
          }
        }
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_3b0,local_3f0._M_dataplus._M_p,
                            local_3f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      }
LAB_00169ce3:
      lVar1 = *(long *)(local_238[0] + -0x18);
    } while (*(int *)((long)aiStack_218 + lVar1) == 0);
  }
  std::__cxx11::stringbuf::str();
  bVar3 = local_3f8 != (Logger *)0x0;
  if (local_418 != local_408) {
    operator_delete(local_418);
  }
  if (bVar3 && local_410 != (string *)0x0) {
    configureFromGlobal::anon_class_16_2_58e2ca49::operator()(&local_3d0);
  }
  std::__cxx11::stringstream::~stringstream(local_3c0);
  std::ios_base::~ios_base(local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void Loggers::configureFromGlobal(const char* globalConfigurationFilePath) {
  std::ifstream gcfStream(globalConfigurationFilePath, std::ifstream::in);
  ELPP_ASSERT(gcfStream.is_open(), "Unable to open global configuration file [" << globalConfigurationFilePath
              << "] for parsing.");
  std::string line = std::string();
  std::stringstream ss;
  Logger* logger = nullptr;
  auto configure = [&](void) {
    ELPP_INTERNAL_INFO(8, "Configuring logger: '" << logger->id() << "' with configurations \n" << ss.str()
                       << "\n--------------");
    Configurations c;
    c.parseFromText(ss.str());
    logger->configure(c);
  };
  while (gcfStream.good()) {
    std::getline(gcfStream, line);
    ELPP_INTERNAL_INFO(1, "Parsing line: " << line);
    base::utils::Str::trim(line);
    if (Configurations::Parser::isComment(line)) continue;
    Configurations::Parser::ignoreComments(&line);
    base::utils::Str::trim(line);
    if (line.size() > 2 && base::utils::Str::startsWith(line, std::string(base::consts::kConfigurationLoggerId))) {
      if (!ss.str().empty() && logger != nullptr) {
        configure();
      }
      ss.str(std::string(""));
      line = line.substr(2);
      base::utils::Str::trim(line);
      if (line.size() > 1) {
        ELPP_INTERNAL_INFO(1, "Getting logger: '" << line << "'");
        logger = getLogger(line);
      }
    } else {
      ss << line << "\n";
    }
  }
  if (!ss.str().empty() && logger != nullptr) {
    configure();
  }
}